

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

double * __thiscall vec<3UL,_double>::operator[](vec<3UL,_double> *this,size_t i)

{
  long lVar1;
  
  if (i < 3) {
    lVar1 = (ulong)(i != 1) * 8 + 8;
    if (i == 0) {
      lVar1 = 0;
    }
    return (double *)((long)&this->x + lVar1);
  }
  __assert_fail("i >= 0 && i < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                ,0x8c,"T &vec<3>::operator[](const size_t) [n = 3, T = double]");
}

Assistant:

T& operator[](const size_t i)
    {
        assert(i >= 0 && i < 3);
        return i == 0 ? x : (1 == i ? y : z);
    }